

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O3

ktx_error_code_e
ktxTexture2_IterateLoadLevelFaces(ktxTexture2 *This,PFNKTXITERCB iterCb,void *userdata)

{
  ktxSupercmpScheme kVar1;
  ktxTexture_protected *pkVar2;
  ktxTexture2_private *pkVar3;
  ktx_uint64_t kVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ktx_error_code_e kVar8;
  uint uVar9;
  ZSTD_ErrorCode ZVar10;
  uchar *pSrc;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  ktxStream *pkVar16;
  uint uVar17;
  int iVar18;
  uchar *puVar19;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  undefined1 extraout_var_01 [12];
  undefined1 auVar22 [12];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uchar *local_a8;
  ZSTD_DCtx *local_a0;
  uchar *local_80;
  ktx_size_t uncompressedDataSize;
  ktxStream *local_48;
  size_t local_40;
  long local_38;
  
  pkVar2 = This->_protected;
  uncompressedDataSize = 0;
  kVar8 = KTX_INVALID_OPERATION;
  if (((This->classId == ktxTexture2_c) && (kVar1 = This->supercompressionScheme, kVar1 < 4)) &&
     (kVar1 != KTX_SS_BASIS_LZ)) {
    if (iterCb == (PFNKTXITERCB)0x0) {
      kVar8 = KTX_INVALID_VALUE;
    }
    else if ((pkVar2->_stream).data.file != (FILE *)0x0) {
      pkVar3 = This->_private;
      local_40 = pkVar3->_levelIndex[0].byteLength;
      pSrc = (uchar *)malloc(local_40);
      kVar8 = KTX_OUT_OF_MEMORY;
      if (pSrc != (uchar *)0x0) {
        if ((kVar1 & ~KTX_SS_BASIS_LZ) == KTX_SS_ZSTD) {
          uncompressedDataSize = pkVar3->_levelIndex[0].uncompressedByteLength;
          local_a8 = (uchar *)malloc(uncompressedDataSize);
          if (local_a8 == (uchar *)0x0) {
            free(pSrc);
            return KTX_OUT_OF_MEMORY;
          }
          local_80 = local_a8;
          if (kVar1 == KTX_SS_ZSTD) {
            local_a0 = ZSTD_createDCtx();
          }
          else {
            local_a0 = (ZSTD_DCtx *)0x0;
          }
        }
        else {
          local_a0 = (ZSTD_DCtx *)0x0;
          local_a8 = (uchar *)0x0;
          local_80 = pSrc;
        }
        uVar14 = This->numLevels - 1;
        pkVar16 = &pkVar2->_stream;
        if (-1 < (int)uVar14) {
          do {
            local_48 = pkVar16;
            pkVar16 = local_48;
            bVar13 = (byte)uVar14;
            uVar6 = This->baseWidth >> (bVar13 & 0x1f);
            iVar7 = uVar6 + (uVar6 == 0);
            uVar6 = This->baseHeight >> (bVar13 & 0x1f);
            iVar18 = uVar6 + (uVar6 == 0);
            uVar6 = This->baseDepth >> (bVar13 & 0x1f);
            iVar15 = uVar6 + (uVar6 == 0);
            uVar11 = (ulong)uVar14;
            uVar12 = pkVar3->_levelIndex[uVar11].byteLength;
            kVar8 = KTX_FILE_DATA_ERROR;
            if (local_40 < uVar12) goto LAB_001eacf9;
            kVar4 = This->_private->_firstLevelFileOffset;
            if (kVar4 == 0) {
              __assert_fail("This->_private->_firstLevelFileOffset != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                            ,0x69b,
                            "ktx_uint64_t ktxTexture2_levelFileOffset(ktxTexture2 *, ktx_uint32_t)")
              ;
            }
            local_38 = uVar11 * 3;
            kVar8 = (*(pkVar2->_stream).setpos)
                              (local_48,kVar4 + This->_private->_levelIndex[uVar11].byteOffset);
            if ((kVar8 != KTX_SUCCESS) ||
               (kVar8 = (*pkVar16->read)(pkVar16,pSrc,uVar12), kVar8 != KTX_SUCCESS))
            goto LAB_001eacf9;
            if (This->supercompressionScheme != KTX_SS_END_RANGE) {
              auVar22 = extraout_var;
              if (This->supercompressionScheme != KTX_SS_ZSTD) goto LAB_001eab5f;
              uVar12 = ZSTD_decompressDCtx(local_a0,local_a8,uncompressedDataSize,pSrc,uVar12);
              uVar6 = ZSTD_isError(uVar12);
              auVar22 = extraout_var_00;
              if (uVar6 == 0) goto LAB_001eab5f;
              ZVar10 = ZSTD_getErrorCode(uVar12);
              if (ZVar10 == ZSTD_error_dstSize_tooSmall) {
LAB_001eacea:
                kVar8 = KTX_DECOMPRESS_LENGTH_ERROR;
              }
              else if (ZVar10 == ZSTD_error_memory_allocation) {
                kVar8 = KTX_OUT_OF_MEMORY;
              }
              else {
                kVar8 = KTX_FILE_DATA_ERROR;
                if (ZVar10 == ZSTD_error_checksum_wrong) {
                  kVar8 = KTX_DECOMPRESS_CHECKSUM_ERROR;
                }
              }
              goto LAB_001eacf9;
            }
            kVar8 = ktxUncompressZLIBInt(local_a8,&uncompressedDataSize,pSrc,uVar12);
            auVar22 = extraout_var_01;
            if (kVar8 != KTX_SUCCESS) {
              return kVar8;
            }
LAB_001eab5f:
            if ((&pkVar3->_levelIndex[0].uncompressedByteLength)[local_38] != uVar12)
            goto LAB_001eacea;
            if ((This->isCubemap == true) && (This->isArray == false)) {
              auVar20._0_4_ = (float)iVar7 / (float)(pkVar2->_formatSize).blockWidth;
              auVar20._4_12_ = auVar22;
              auVar20 = roundss(auVar20,auVar20,10);
              auVar21 = ZEXT416((uint)((float)iVar18 / (float)(pkVar2->_formatSize).blockHeight));
              auVar21 = roundss(auVar21,auVar21,10);
              uVar6 = (pkVar2->_formatSize).minBlocksX;
              uVar17 = (uint)(long)auVar20._0_4_;
              if (uVar17 < uVar6) {
                uVar17 = uVar6;
              }
              uVar9 = (uint)(long)auVar21._0_4_;
              if (uVar9 < uVar6) {
                uVar9 = uVar6;
              }
              if (This->numFaces != 0) {
                uVar12 = (ulong)(uVar17 * (pkVar2->_formatSize).blockSizeInBits * uVar9 >> 3);
                uVar6 = 0;
                puVar19 = local_80;
                do {
                  kVar8 = (*iterCb)(uVar14,uVar6,iVar7,iVar18,iVar15,uVar12,puVar19,userdata);
                  if (kVar8 != KTX_SUCCESS) goto LAB_001eacf9;
                  puVar19 = puVar19 + uVar12;
                  uVar6 = uVar6 + 1;
                } while (uVar6 < This->numFaces);
              }
            }
            else {
              kVar8 = (*iterCb)(uVar14,0,iVar7,iVar18,iVar15,uVar12 & 0xffffffff,local_80,userdata);
              if (kVar8 != KTX_SUCCESS) goto LAB_001eacf9;
            }
            bVar5 = 0 < (int)uVar14;
            pkVar16 = local_48;
            uVar14 = uVar14 - 1;
          } while (bVar5);
        }
        (*(pkVar2->_stream).destruct)(pkVar16);
        This->_private->_firstLevelFileOffset = 0;
        kVar8 = KTX_SUCCESS;
LAB_001eacf9:
        free(pSrc);
        if (local_a8 != (uchar *)0x0) {
          free(local_a8);
        }
        if (local_a0 != (ZSTD_DCtx *)0x0) {
          ZSTD_freeDCtx(local_a0);
        }
      }
    }
  }
  return kVar8;
}

Assistant:

KTX_error_code
ktxTexture2_IterateLoadLevelFaces(ktxTexture2* This, PFNKTXITERCB iterCb,
                                  void* userdata)
{
    DECLARE_PROTECTED(ktxTexture);
    ktxStream* stream = (ktxStream *)&prtctd->_stream;
    ktxLevelIndexEntry* levelIndex;
    ktx_size_t      dataSize = 0, uncompressedDataSize = 0;
    KTX_error_code  result = KTX_SUCCESS;
    ktx_uint8_t*    dataBuf = NULL;
    ktx_uint8_t*    uncompressedDataBuf = NULL;
    ktx_uint8_t*    pData;
    ZSTD_DCtx*      dctx = NULL;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (This->classId != ktxTexture2_c)
        return KTX_INVALID_OPERATION;

    if (This->supercompressionScheme != KTX_SS_NONE &&
        This->supercompressionScheme != KTX_SS_ZSTD &&
        This->supercompressionScheme != KTX_SS_ZLIB)
        return KTX_INVALID_OPERATION;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    if (prtctd->_stream.data.file == NULL)
        // This Texture not created from a stream or images are already loaded.
        return KTX_INVALID_OPERATION;

    levelIndex = This->_private->_levelIndex;

    // Allocate memory sufficient for the base level
    dataSize = levelIndex[0].byteLength;
    dataBuf = malloc(dataSize);
    if (!dataBuf)
        return KTX_OUT_OF_MEMORY;
    if (This->supercompressionScheme == KTX_SS_ZSTD || This->supercompressionScheme == KTX_SS_ZLIB) {
        uncompressedDataSize = levelIndex[0].uncompressedByteLength;
        uncompressedDataBuf = malloc(uncompressedDataSize);
        if (!uncompressedDataBuf) {
            result = KTX_OUT_OF_MEMORY;
            goto cleanup;
        }
        if (This->supercompressionScheme == KTX_SS_ZSTD) {
            dctx = ZSTD_createDCtx();
        }
        pData = uncompressedDataBuf;
    } else {
        pData = dataBuf;
    }

    for (ktx_int32_t level = This->numLevels - 1; level >= 0; --level)
    {
        ktx_size_t   levelSize;
        GLsizei      width, height, depth;

        // Array textures have the same number of layers at each mip level.
        width = MAX(1, This->baseWidth  >> level);
        height = MAX(1, This->baseHeight >> level);
        depth = MAX(1, This->baseDepth  >> level);

        levelSize = levelIndex[level].byteLength;
        if (dataSize < levelSize) {
            // Levels cannot be larger than the base level
            result = KTX_FILE_DATA_ERROR;
            goto cleanup;
        }

        // Use setpos so we skip any padding.
        result = stream->setpos(stream,
                                ktxTexture2_levelFileOffset(This, level));
        if (result != KTX_SUCCESS)
            goto cleanup;

        result = stream->read(stream, dataBuf, levelSize);
        if (result != KTX_SUCCESS)
            goto cleanup;

        if (This->supercompressionScheme == KTX_SS_ZSTD) {
            levelSize =
                ZSTD_decompressDCtx(dctx, uncompressedDataBuf,
                                  uncompressedDataSize,
                                  dataBuf,
                                  levelSize);
            if (ZSTD_isError(levelSize)) {
                ZSTD_ErrorCode error = ZSTD_getErrorCode(levelSize);
                switch(error) {
                  case ZSTD_error_dstSize_tooSmall:
                    result = KTX_DECOMPRESS_LENGTH_ERROR; // inflatedDataCapacity too small.
                    goto cleanup;
                  case ZSTD_error_checksum_wrong:
                    result =  KTX_DECOMPRESS_CHECKSUM_ERROR;
                    goto cleanup;
                  case ZSTD_error_memory_allocation:
                    result = KTX_OUT_OF_MEMORY;
                    goto cleanup;
                  default:
                    result = KTX_FILE_DATA_ERROR;
                    goto cleanup;
                }
            }

            // We don't fix up the texture's dataSize, levelIndex or
            // _requiredAlignment because after this function completes there
            // is no way to get at the texture's data.
            //nindex[level].byteOffset = levelOffset;
            //nindex[level].uncompressedByteLength = nindex[level].byteLength =
                                                                //levelByteLength;
        } else if (This->supercompressionScheme == KTX_SS_ZLIB) {
            result = ktxUncompressZLIBInt(uncompressedDataBuf,
                                            &uncompressedDataSize,
                                            dataBuf,
                                            levelSize);
            if (result != KTX_SUCCESS)
                return result;
        }

        if (levelIndex[level].uncompressedByteLength != levelSize) {
            result = KTX_DECOMPRESS_LENGTH_ERROR;
            goto cleanup;
        }


#if IS_BIG_ENDIAN
        switch (prtctd->_typeSize) {
          case 2:
            _ktxSwapEndian16((ktx_uint16_t*)pData, levelSize / 2);
            break;
          case 4:
            _ktxSwapEndian32((ktx_uint32_t*)pDest, levelSize / 4);
            break;
          case 8:
            _ktxSwapEndian64((ktx_uint64_t*)pDest, levelSize / 8);
            break;
        }
#endif

        // With the exception of non-array cubemaps the entire level
        // is passed at once because that is how OpenGL and Vulkan need them.
        // Vulkan could take all the faces at once too but we iterate
        // them separately for OpenGL.
        if (This->isCubemap && !This->isArray) {
            ktx_uint8_t* pFace = pData;
            struct blockCount {
                ktx_uint32_t x, y;
            } blockCount;
            ktx_size_t faceSize;

            blockCount.x
              = (uint32_t)ceilf((float)width / prtctd->_formatSize.blockWidth);
            blockCount.y
              = (uint32_t)ceilf((float)height / prtctd->_formatSize.blockHeight);
            blockCount.x = MAX(prtctd->_formatSize.minBlocksX, blockCount.x);
            blockCount.y = MAX(prtctd->_formatSize.minBlocksX, blockCount.y);
            faceSize = blockCount.x * blockCount.y
                       * prtctd->_formatSize.blockSizeInBits / 8;

            for (ktx_uint32_t face = 0; face < This->numFaces; ++face) {
                result = iterCb(level, face,
                                width, height, depth,
                                (ktx_uint32_t)faceSize, pFace, userdata);
                pFace += faceSize;
                if (result != KTX_SUCCESS)
                    goto cleanup;
            }
        } else {
            result = iterCb(level, 0,
                             width, height, depth,
                             (ktx_uint32_t)levelSize, pData, userdata);
            if (result != KTX_SUCCESS)
                goto cleanup;
       }
    }

    // No further need for this.
    stream->destruct(stream);
    This->_private->_firstLevelFileOffset = 0;
cleanup:
    free(dataBuf);
    if (uncompressedDataBuf) free(uncompressedDataBuf);
    if (dctx) ZSTD_freeDCtx(dctx);

    return result;
}